

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O3

void __thiscall WasmCGen::Local_set(WasmCGen *this)

{
  string local_30;
  
  printf("/*%s*/\n","Local_set");
  Local_tee(this);
  w3SourceGenStack::pop_abi_cxx11_(&local_30,&(this->super_w3SourceGen).stack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CGEN (Local_set)
{
    printf ("/*%s*/\n", __func__);
    Local_tee ();
    pop ();
}